

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

Value * __thiscall cmake::ReportVersionJson(Value *__return_storage_ptr__,cmake *this)

{
  Value *pVVar1;
  Value local_100;
  Value local_d8;
  Value local_b0;
  Value local_88;
  Value local_60;
  Value local_38;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_38,"3.14.20190320-g51f3a");
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"string");
  Json::Value::operator=(pVVar1,&local_38);
  Json::Value::~Value(&local_38);
  Json::Value::Value(&local_60,3);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"major");
  Json::Value::operator=(pVVar1,&local_60);
  Json::Value::~Value(&local_60);
  Json::Value::Value(&local_88,0xe);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"minor");
  Json::Value::operator=(pVVar1,&local_88);
  Json::Value::~Value(&local_88);
  Json::Value::Value(&local_b0,"g51f3a");
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"suffix");
  Json::Value::operator=(pVVar1,&local_b0);
  Json::Value::~Value(&local_b0);
  Json::Value::Value(&local_d8,false);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"isDirty");
  Json::Value::operator=(pVVar1,&local_d8);
  Json::Value::~Value(&local_d8);
  Json::Value::Value(&local_100,0x1341470);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"patch");
  Json::Value::operator=(pVVar1,&local_100);
  Json::Value::~Value(&local_100);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmake::ReportVersionJson() const
{
  Json::Value version = Json::objectValue;
  version["string"] = CMake_VERSION;
  version["major"] = CMake_VERSION_MAJOR;
  version["minor"] = CMake_VERSION_MINOR;
  version["suffix"] = CMake_VERSION_SUFFIX;
  version["isDirty"] = (CMake_VERSION_IS_DIRTY == 1);
  version["patch"] = CMake_VERSION_PATCH;
  return version;
}